

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

void http1_on_data(intptr_t uuid,fio_protocol_s *protocol)

{
  _func_void_intptr_t_fio_protocol_s_ptr *p_Var1;
  ssize_t sVar2;
  
  if (*(char *)((long)&protocol[5].on_ready + 2) != '\0') {
    fio_suspend(uuid);
    return;
  }
  p_Var1 = protocol[4].ping;
  if (p_Var1 != (_func_void_intptr_t_fio_protocol_s_ptr *)0x2000) {
    sVar2 = fio_read(uuid,p_Var1 + (long)((long)&protocol[5].on_ready + 3),0x2000 - (long)p_Var1);
    if (0 < sVar2) {
      protocol[4].ping = protocol[4].ping + sVar2;
    }
  }
  http1_consume_data(uuid,(http1pr_s *)protocol);
  return;
}

Assistant:

static void http1_on_data(intptr_t uuid, fio_protocol_s *protocol) {
  http1pr_s *p = (http1pr_s *)protocol;
  if (p->stop) {
    fio_suspend(uuid);
    return;
  }
  ssize_t i = 0;
  if (HTTP_MAX_HEADER_LENGTH - p->buf_len)
    i = fio_read(uuid, p->buf + p->buf_len,
                 HTTP_MAX_HEADER_LENGTH - p->buf_len);
  if (i > 0) {
    p->buf_len += i;
  }
  http1_consume_data(uuid, p);
}